

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O0

InsertResult * __thiscall
stick::HashMap<stick::String,_unsigned_long,_stick::DefaultHash>::insert
          (InsertResult *__return_storage_ptr__,
          HashMap<stick::String,_unsigned_long,_stick::DefaultHash> *this,KeyValuePair *_val)

{
  Float32 FVar1;
  undefined1 local_60 [4];
  Float32 lf;
  ValueType local_40;
  Node *local_38;
  Node *prev;
  Node *n;
  Bucket *b;
  Size bi;
  KeyValuePair *_val_local;
  HashMap<stick::String,_unsigned_long,_stick::DefaultHash> *this_local;
  
  bi = (Size)_val;
  _val_local = (KeyValuePair *)this;
  b = (Bucket *)bucketIndex(this,&_val->key);
  n = (Node *)(this->m_buckets + (long)b);
  findHelper(this,(Size)b,(KeyType *)bi,&prev,&local_38);
  if (prev == (Node *)0x0) {
    String::String((String *)local_60,(String *)bi);
    local_40 = *(ValueType *)(bi + 0x20);
    prev = createNode(this,(KeyValuePair *)local_60,(Size)b);
    KeyValuePair::~KeyValuePair((KeyValuePair *)local_60);
    if (local_38 == (Node *)0x0) {
      (n->kv).key.m_cStr = (char *)prev;
    }
    else {
      prev->prev = local_38;
      local_38->next = prev;
    }
    this->m_count = this->m_count + 1;
    FVar1 = loadFactor(this);
    if ((float)this->m_maxLoadFactor <= (float)FVar1 && (float)FVar1 != (float)this->m_maxLoadFactor
       ) {
      rehash(this,this->m_bucketCount << 1);
    }
    IterT<stick::HashMap<stick::String,_unsigned_long,_stick::DefaultHash>_>::IterT
              (&__return_storage_ptr__->iterator,this,(Size)b,prev);
    __return_storage_ptr__->inserted = true;
  }
  else {
    if (local_38 != prev->prev) {
      __assert_fail("prev == n->prev",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/HashMap.hpp"
                    ,0x161,
                    "InsertResult stick::HashMap<stick::String, unsigned long>::insert(KeyValuePair &&) [K = stick::String, V = unsigned long, H = stick::DefaultHash]"
                   );
    }
    (prev->kv).value = *(ValueType *)(bi + 0x20);
    IterT<stick::HashMap<stick::String,_unsigned_long,_stick::DefaultHash>_>::IterT
              (&__return_storage_ptr__->iterator,this,(Size)b,prev);
    __return_storage_ptr__->inserted = false;
  }
  return __return_storage_ptr__;
}

Assistant:

inline InsertResult insert(KeyValuePair && _val)
    {
        Size bi = bucketIndex(_val.key);
        Bucket & b = m_buckets[bi];

        // check if the key allready exists
        Node *n, *prev;
        findHelper(bi, _val.key, n, prev);

        // the key allready exists, change the value
        if (n)
        {
            STICK_ASSERT(prev == n->prev);
            n->kv.value = std::move(_val.value);
            return { Iter(*this, bi, n), false };
        }
        else
        {
            // otherwise create the node n stuff
            n = createNode({ _val.key, std::move(_val.value) }, bi);
            if (prev)
            {
                n->prev = prev;
                prev->next = n;
            }
            else
            {
                b.first = n;
            }
            ++m_count;
        }

        Float32 lf = loadFactor();
        if (lf > m_maxLoadFactor)
        {
            rehash(m_bucketCount * 2);
        }

        return { Iter(*this, bi, n), true };
    }